

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *in_stack_ffffffffffffe400;
  allocator<char> *in_stack_ffffffffffffe410;
  char *in_stack_ffffffffffffe418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe420;
  TPZGeoBlend<pzgeom::TPZGeoPrism> *in_stack_ffffffffffffe430;
  TPZGeoBlend<pzgeom::TPZGeoPrism> *in_stack_ffffffffffffe470;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe420,in_stack_ffffffffffffe418,in_stack_ffffffffffffe410);
  uVar1 = Hash(in_stack_ffffffffffffe400);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x16ce126);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend(in_stack_ffffffffffffe470);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::ClassId(in_stack_ffffffffffffe430);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::~TPZGeoBlend
            ((TPZGeoBlend<pzgeom::TPZGeoPrism> *)0x16ce173);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}